

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t process_extra(archive_read *a,char *p,size_t extra_length,zip_entry *zip_entry)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  ushort uVar9;
  uint16_t uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (extra_length == 0) {
    return L'\0';
  }
  if (extra_length < 4) {
    archive_set_error(&a->archive,0x54,
                      "Too-small extra data: Need at least 4 bytes, but only found %d bytes",
                      extra_length & 0xffffffff);
  }
  else {
    uVar6 = 0;
    do {
      uVar9 = *(ushort *)(p + uVar6 + 2);
      uVar5 = (uint)uVar9;
      iVar3 = (int)uVar6;
      uVar8 = iVar3 + 4;
      if (extra_length < iVar3 + (uint)uVar9 + 4) {
        extra_length = (size_t)((int)extra_length - uVar8);
        pcVar7 = "Extra data overflow: Need %d bytes but only found %d bytes";
        uVar6 = (ulong)uVar5;
        goto LAB_0048acd7;
      }
      uVar2 = *(ushort *)(p + uVar6);
      uVar12 = uVar5;
      if (uVar2 < 0x6c78) {
        if (uVar2 == 1) {
          zip_entry->flags = zip_entry->flags | 1;
          if (zip_entry->uncompressed_size == 0xffffffff) {
            if (7 < uVar9) {
              if (-1 < (long)((ulong)*(uint *)(p + (ulong)uVar8 + 4) << 0x20)) {
                zip_entry->uncompressed_size =
                     CONCAT44(*(uint *)(p + (ulong)uVar8 + 4),*(undefined4 *)(p + uVar8));
                uVar8 = iVar3 + 0xc;
                uVar5 = uVar5 - 8;
                goto LAB_0048a9e2;
              }
            }
            pcVar7 = "Malformed 64-bit uncompressed size";
            goto LAB_0048ad0b;
          }
LAB_0048a9e2:
          if (zip_entry->compressed_size == 0xffffffff) {
            if (7 < (ushort)uVar5) {
              if (-1 < (long)((ulong)*(uint *)(p + (ulong)uVar8 + 4) << 0x20)) {
                zip_entry->compressed_size =
                     CONCAT44(*(uint *)(p + (ulong)uVar8 + 4),*(undefined4 *)(p + uVar8));
                uVar8 = uVar8 + 8;
                uVar5 = uVar5 - 8;
                goto LAB_0048aa15;
              }
            }
            pcVar7 = "Malformed 64-bit compressed size";
            goto LAB_0048ad0b;
          }
LAB_0048aa15:
          uVar12 = uVar5;
          if (zip_entry->local_header_offset == 0xffffffff) {
            if (7 < (ushort)uVar5) {
              if (-1 < (long)((ulong)*(uint *)(p + (ulong)uVar8 + 4) << 0x20)) {
                zip_entry->local_header_offset =
                     CONCAT44(*(uint *)(p + (ulong)uVar8 + 4),*(undefined4 *)(p + uVar8));
                uVar8 = uVar8 + 8;
                uVar12 = uVar5 - 8;
                goto LAB_0048ac9c;
              }
            }
            pcVar7 = "Malformed 64-bit local header offset";
LAB_0048ad0b:
            archive_set_error(&a->archive,0x54,pcVar7);
            return L'\xffffffe7';
          }
        }
        else if (uVar2 == 0x5455) {
          if (uVar9 == 0) {
            pcVar7 = "Incomplete extended time field";
            goto LAB_0048ad0b;
          }
          bVar1 = p[uVar8];
          uVar8 = iVar3 + 5;
          uVar12 = uVar5 - 1;
          if ((bVar1 & 1) != 0) {
            if (uVar9 < 5) goto LAB_0048ac9c;
            zip_entry->mtime = (ulong)*(uint *)(p + uVar8);
            uVar8 = iVar3 + 9;
            uVar12 = uVar5 - 5;
          }
          if ((bVar1 & 2) != 0) {
            if ((ushort)uVar12 < 4) goto LAB_0048ac9c;
            zip_entry->atime = (ulong)*(uint *)(p + uVar8);
            uVar8 = uVar8 + 4;
            uVar12 = uVar12 - 4;
          }
          if (((bVar1 & 4) != 0) && (3 < (ushort)uVar12)) {
            zip_entry->ctime = (ulong)*(uint *)(p + uVar8);
            uVar8 = uVar8 + 4;
            uVar12 = uVar12 - 4;
          }
        }
        else if ((uVar2 == 0x5855) && (7 < uVar9)) {
          zip_entry->atime = (ulong)*(uint *)(p + uVar8);
          zip_entry->mtime = (ulong)*(uint *)(p + (ulong)uVar8 + 4);
          if (0xb < uVar9) {
            zip_entry->uid = (ulong)*(ushort *)(p + (ulong)uVar8 + 8);
            uVar6 = (ulong)*(ushort *)(p + (ulong)uVar8 + 10);
            goto LAB_0048a92a;
          }
        }
      }
      else if (uVar2 < 0x7875) {
        if (uVar2 == 0x6c78) {
          if (uVar9 == 0) {
LAB_0048ab5a:
            uVar12 = 0;
          }
          else {
            bVar1 = p[uVar8];
            uVar8 = iVar3 + 5;
            uVar12 = uVar5 - 1;
            if (((char)bVar1 < '\0') && ((short)uVar12 != 0)) {
              do {
                uVar5 = uVar12;
                uVar6 = (ulong)uVar8;
                uVar8 = uVar8 + 1;
                uVar12 = uVar5 - 1;
                if (-1 < p[uVar6]) break;
              } while ((short)uVar5 != 1);
            }
            if ((bVar1 & 1) != 0) {
              if ((ushort)uVar5 < 3) goto LAB_0048ac9c;
              zip_entry->system = p[(ulong)uVar8 + 1];
              uVar8 = uVar8 + 2;
              uVar12 = uVar5 - 3;
            }
            if ((bVar1 & 2) != 0) {
              if ((ushort)uVar12 < 2) goto LAB_0048ac9c;
              uVar8 = uVar8 + 2;
              uVar12 = uVar12 - 2;
            }
            if ((bVar1 & 4) != 0) {
              if ((ushort)uVar12 < 4) goto LAB_0048ac9c;
              uVar5 = *(uint *)(p + uVar8);
              if (zip_entry->system == '\0') {
                uVar9 = 0x41fd;
                if ((uVar5 & 0x10) == 0) {
                  uVar9 = 0x81b4;
                }
                zip_entry->mode = uVar9;
                if ((uVar5 & 1) != 0) {
                  uVar10 = uVar9 & 0x16d;
                  goto LAB_0048ac5f;
                }
              }
              else {
                if (zip_entry->system == '\x03') {
                  uVar10 = (uint16_t)(uVar5 >> 0x10);
                }
                else {
                  uVar10 = 0;
                }
LAB_0048ac5f:
                zip_entry->mode = uVar10;
              }
              uVar8 = uVar8 + 4;
              uVar12 = uVar12 - 4;
            }
            if (((bVar1 & 8) != 0) && (1 < (ushort)uVar12)) {
              uVar9 = *(ushort *)(p + uVar8);
              uVar8 = uVar8 + 2;
              uVar12 = uVar12 - 2;
              if (uVar9 <= (ushort)uVar12) {
                uVar8 = uVar8 + uVar9;
                uVar12 = uVar12 - uVar9;
              }
            }
          }
        }
        else if ((uVar2 == 0x7855) && (1 < uVar9)) {
          zip_entry->uid = (ulong)*(ushort *)(p + uVar8);
          if (3 < uVar9) {
            uVar6 = (ulong)*(ushort *)(p + (ulong)uVar8 + 2);
            goto LAB_0048a92a;
          }
        }
      }
      else if (uVar2 == 0x7875) {
        if (uVar9 == 0) goto LAB_0048ab5a;
        uVar6 = (ulong)uVar8;
        if (p[uVar6] == '\x01') {
          uVar13 = 0;
          if (3 < uVar9) {
            bVar1 = p[iVar3 + 5];
            uVar13 = (ulong)bVar1;
            if (bVar1 == 2) {
              uVar11 = (ulong)*(ushort *)(p + uVar6 + 2);
              uVar13 = 2;
            }
            else {
              if ((uVar9 < 6) || (bVar1 != 4)) goto LAB_0048abf4;
              uVar11 = (ulong)*(uint *)(p + uVar6 + 2);
              uVar13 = 4;
            }
            zip_entry->uid = uVar11;
          }
LAB_0048abf4:
          iVar4 = (int)uVar13;
          if (iVar4 + 5U <= uVar5) {
            if (p[iVar3 + iVar4 + 6] == '\x04') {
              if (iVar4 + 7U <= uVar5) {
                uVar6 = (ulong)*(uint *)(p + uVar13 + uVar6 + 3);
                goto LAB_0048a92a;
              }
            }
            else if (p[iVar3 + iVar4 + 6] == '\x02') {
              uVar6 = (ulong)*(ushort *)(p + uVar13 + uVar6 + 3);
LAB_0048a92a:
              zip_entry->gid = uVar6;
            }
          }
        }
      }
      else if (uVar2 == 0x9901) {
        if (uVar9 < 6) {
          pcVar7 = "Incomplete AES field";
          goto LAB_0048ad0b;
        }
        if ((p[iVar3 + 6] == 'A') && (p[iVar3 + 7] == 'E')) {
          (zip_entry->aes_extra).vendor = (uint)*(ushort *)(p + uVar8);
          (zip_entry->aes_extra).strength = (int)p[iVar3 + 8];
          (zip_entry->aes_extra).compression = p[iVar3 + 9];
        }
      }
LAB_0048ac9c:
      uVar6 = (ulong)((uVar12 & 0xffff) + uVar8);
    } while (uVar6 <= extra_length - 4);
    if (uVar6 == extra_length) {
      return L'\0';
    }
    pcVar7 = "Malformed extra data: Consumed %d bytes of %d bytes";
LAB_0048acd7:
    archive_set_error(&a->archive,0x54,pcVar7,uVar6,extra_length);
  }
  return L'\xffffffe7';
}

Assistant:

static int
process_extra(struct archive_read *a, const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;

	if (extra_length == 0) {
		return ARCHIVE_OK;
	}

	if (extra_length < 4) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Too-small extra data: Need at least 4 bytes, but only found %d bytes", (int)extra_length);
		return ARCHIVE_FAILED;
	}
	while (offset <= extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Extra data overflow: Need %d bytes but only found %d bytes",
			    (int)datasize, (int)(extra_length - offset));
			return ARCHIVE_FAILED;
		}
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) > INT64_MAX) {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit uncompressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->uncompressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) > INT64_MAX) {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit compressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->compressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) > INT64_MAX) {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit local header offset");
					return ARCHIVE_FAILED;
				}
				zip_entry->local_header_offset = t;
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags;
			if (datasize == 0) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete extended time field");
				return ARCHIVE_FAILED;
			}
			flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap & 8, 2 byte comment length + n byte comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				} else if (zip_entry->system == 0) {
					// Interpret MSDOS directory bit
					if (0x10 == (external_attributes & 0x10)) {
						zip_entry->mode = AE_IFDIR | 0775;
					} else {
						zip_entry->mode = AE_IFREG | 0664;
					}
					if (0x01 == (external_attributes & 0x01)) {
						// Read-only bit; strip write permissions
						zip_entry->mode &= 0555;
					}
				} else {
					zip_entry->mode = 0;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff & (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZip AES extra data field. */
			if (datasize < 6) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete AES field");
				return ARCHIVE_FAILED;
			}
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
	if (offset != extra_length) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Malformed extra data: Consumed %d bytes of %d bytes",
		    (int)offset, (int)extra_length);
		return ARCHIVE_FAILED;
	}
	return ARCHIVE_OK;
}